

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

GreaterThanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_greaterthan(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x33e) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x33e;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    GreaterThanLayerParams::GreaterThanLayerParams(this_00.greaterthan_);
    (this->layer_).greaterthan_ = (GreaterThanLayerParams *)this_00;
  }
  return (GreaterThanLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::GreaterThanLayerParams* NeuralNetworkLayer::mutable_greaterthan() {
  if (!has_greaterthan()) {
    clear_layer();
    set_has_greaterthan();
    layer_.greaterthan_ = new ::CoreML::Specification::GreaterThanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.greaterThan)
  return layer_.greaterthan_;
}